

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_struct_member
          (CompilerGLSL *this,SPIRType *type,uint32_t member_type_id,uint32_t index,
          string *qualifier,uint32_t param_5)

{
  __node_base_ptr p_Var1;
  bool bVar2;
  mapped_type *pmVar3;
  size_t sVar4;
  Decoration *pDVar5;
  bool local_17a;
  undefined1 local_158 [64];
  undefined1 local_118 [64];
  string local_d8 [39];
  bool local_b1;
  string local_b0 [7];
  bool is_block;
  string qualifiers;
  Vector<Decoration> *memb;
  Bitset memberflags;
  SPIRType *membertype;
  uint32_t param_5_local;
  string *qualifier_local;
  uint32_t index_local;
  uint32_t member_type_id_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  memberflags.higher._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,member_type_id);
  Bitset::Bitset((Bitset *)&memb);
  pmVar3 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_Compiler).ir.meta,&(type->super_IVariant).self);
  sVar4 = VectorView<spirv_cross::Meta::Decoration>::size
                    (&(pmVar3->members).super_VectorView<spirv_cross::Meta::Decoration>);
  if (index < sVar4) {
    pDVar5 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                       (&(pmVar3->members).super_VectorView<spirv_cross::Meta::Decoration>,
                        (ulong)index);
    Bitset::operator=((Bitset *)&memb,&pDVar5->decoration_flags);
  }
  ::std::__cxx11::string::string(local_b0);
  pmVar3 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_Compiler).ir.meta,&(type->super_IVariant).self);
  bVar2 = Bitset::get(&(pmVar3->decoration).decoration_flags,2);
  local_17a = true;
  if (!bVar2) {
    pmVar3 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[](&(this->super_Compiler).ir.meta,&(type->super_IVariant).self);
    local_17a = Bitset::get(&(pmVar3->decoration).decoration_flags,3);
  }
  local_b1 = local_17a;
  if (local_17a != false) {
    (*(this->super_Compiler)._vptr_Compiler[0x34])(local_d8,this,&memb);
    ::std::__cxx11::string::operator=(local_b0,local_d8);
    ::std::__cxx11::string::~string(local_d8);
  }
  (*(this->super_Compiler)._vptr_Compiler[0x33])(local_118 + 0x20,this,type,(ulong)index);
  flags_to_qualifiers_glsl_abi_cxx11_
            ((CompilerGLSL *)local_118,(SPIRType *)this,
             (Bitset *)memberflags.higher._M_h._M_single_bucket);
  p_Var1 = memberflags.higher._M_h._M_single_bucket;
  to_member_name_abi_cxx11_((CompilerGLSL *)local_158,(SPIRType *)this,(uint32_t)type);
  (*(this->super_Compiler)._vptr_Compiler[0x1b])(local_158 + 0x20,this,p_Var1,local_158,0);
  statement<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_118 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,qualifier
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_158 + 0x20)
             ,(char (*) [2])0x5e9b70);
  ::std::__cxx11::string::~string((string *)(local_158 + 0x20));
  ::std::__cxx11::string::~string((string *)local_158);
  ::std::__cxx11::string::~string((string *)local_118);
  ::std::__cxx11::string::~string((string *)(local_118 + 0x20));
  ::std::__cxx11::string::~string(local_b0);
  Bitset::~Bitset((Bitset *)&memb);
  return;
}

Assistant:

void CompilerGLSL::emit_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                      const string &qualifier, uint32_t)
{
	auto &membertype = get<SPIRType>(member_type_id);

	Bitset memberflags;
	auto &memb = ir.meta[type.self].members;
	if (index < memb.size())
		memberflags = memb[index].decoration_flags;

	string qualifiers;
	bool is_block = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock) ||
	                ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock);

	if (is_block)
		qualifiers = to_interpolation_qualifiers(memberflags);

	statement(layout_for_member(type, index), qualifiers, qualifier, flags_to_qualifiers_glsl(membertype, memberflags),
	          variable_decl(membertype, to_member_name(type, index)), ";");
}